

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall
BasicBlock::RemoveSucc
          (BasicBlock *this,BasicBlock *block,FlowGraph *graph,bool doCleanPred,bool moveToDead)

{
  undefined1 *puVar1;
  Type pSVar2;
  code *pcVar3;
  bool bVar4;
  Loop *loop;
  Type *ppFVar5;
  undefined4 *puVar6;
  undefined1 local_50 [8];
  EditingIterator iter;
  
  local_50 = (undefined1  [8])&this->succList;
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50;
  iter.last = (NodeBase *)graph;
  do {
    bVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)local_50);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xc9d,"((0))","Edge not found.");
      if (bVar4) {
        *puVar6 = 0;
        return;
      }
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    ppFVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_50);
  } while ((*ppFVar5)->succBlock != block);
  if (moveToDead) {
    SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::MoveCurrentTo
              ((EditingIterator *)local_50,
               &(this->deadSuccList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>)
    ;
  }
  else {
    SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
              ((EditingIterator *)local_50,(ArenaAllocator *)(iter.last)->next);
  }
  if (doCleanPred) {
    RemovePred(block,this,(FlowGraph *)iter.last,false,moveToDead);
  }
  if (((block->field_0x18 & 4) != 0) && (block->loop != (Loop *)0x0)) {
    pSVar2 = (block->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar2 != &block->predList) &&
       ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar2->next == &block->predList)) {
      puVar1 = &block->loop->field_0x178;
      *puVar1 = *puVar1 | 1;
    }
  }
  return;
}

Assistant:

void
BasicBlock::RemoveSucc(BasicBlock *block, FlowGraph * graph, bool doCleanPred, bool moveToDead)
{
    FOREACH_SLISTBASECOUNTED_ENTRY_EDITING(FlowEdge*, edge, this->GetSuccList(), iter)
    {
        if (edge->GetSucc() == block)
        {
            if (moveToDead)
            {
                iter.MoveCurrentTo(this->GetDeadSuccList());
            }
            else
            {
                iter.RemoveCurrent(graph->alloc);
            }

            if (doCleanPred)
            {
                block->RemovePred(this, graph, false, moveToDead);
            }

            if (block->isLoopHeader && block->loop && block->GetPredList()->HasOne())
            {
                Loop *loop = block->loop;
                loop->isDead = true;
            }
            return;
        }
    } NEXT_SLISTBASECOUNTED_ENTRY_EDITING;
    AssertMsg(UNREACHED, "Edge not found.");
}